

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderFirstDocid(Fts3Table *pTab,Fts3SegReader *pReader)

{
  int iVar1;
  Fts3SegReader *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  char **unaff_retaddr;
  int in_stack_0000000c;
  int n;
  int rc;
  u8 bEof;
  u8 *in_stack_00000050;
  sqlite_int64 *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  int iVar2;
  uint7 in_stack_fffffffffffffff0;
  sqlite3_int64 *piDocid;
  
  piDocid = *(sqlite3_int64 **)(in_FS_OFFSET + 0x28);
  iVar2 = 0;
  if ((*(char *)(in_RDI + 0x1cf) == '\0') || (in_RSI->ppNextElem == (Fts3HashElem **)0x0)) {
    iVar2 = fts3SegReaderRequire
                      (in_RSI,(char *)(ulong)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    if (iVar2 == 0) {
      iVar1 = sqlite3Fts3GetVarint
                        ((char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8);
      in_RSI->pOffsetList = in_RSI->aDoclist + iVar1;
    }
  }
  else {
    in_RSI->iDocid = 0;
    in_RSI->nOffsetList = 0;
    sqlite3Fts3DoclistPrev
              (pReader._4_4_,_n,in_stack_0000000c,unaff_retaddr,piDocid,
               (int *)(ulong)in_stack_fffffffffffffff0,in_stack_00000050);
  }
  if (*(sqlite3_int64 **)(in_FS_OFFSET + 0x28) != piDocid) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

static int fts3SegReaderFirstDocid(Fts3Table *pTab, Fts3SegReader *pReader){
  int rc = SQLITE_OK;
  assert( pReader->aDoclist );
  assert( !pReader->pOffsetList );
  if( pTab->bDescIdx && fts3SegReaderIsPending(pReader) ){
    u8 bEof = 0;
    pReader->iDocid = 0;
    pReader->nOffsetList = 0;
    sqlite3Fts3DoclistPrev(0,
        pReader->aDoclist, pReader->nDoclist, &pReader->pOffsetList,
        &pReader->iDocid, &pReader->nOffsetList, &bEof
    );
  }else{
    rc = fts3SegReaderRequire(pReader, pReader->aDoclist, FTS3_VARINT_MAX);
    if( rc==SQLITE_OK ){
      int n = sqlite3Fts3GetVarint(pReader->aDoclist, &pReader->iDocid);
      pReader->pOffsetList = &pReader->aDoclist[n];
    }
  }
  return rc;
}